

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,ExpressionSyntax *args_1,Token *args_2,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_3,ExpressionSyntax *args_4)

{
  Token operatorToken;
  BinaryExpressionSyntax *this_00;
  
  this_00 = (BinaryExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryExpressionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (BinaryExpressionSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  operatorToken.kind = args_2->kind;
  operatorToken._2_1_ = args_2->field_0x2;
  operatorToken.numFlags.raw = (args_2->numFlags).raw;
  operatorToken.rawLen = args_2->rawLen;
  operatorToken.info = args_2->info;
  syntax::BinaryExpressionSyntax::BinaryExpressionSyntax
            (this_00,*args,args_1,operatorToken,args_3,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }